

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_relation.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::ValueRelation::GetQueryNode(ValueRelation *this)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  pointer pSVar3;
  long *in_RSI;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_30;
  TableRef *local_28;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_20;
  
  make_uniq<duckdb::SelectNode>();
  pSVar3 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_20);
  make_uniq<duckdb::StarExpression>();
  local_30._M_head_impl = local_28;
  local_28 = (TableRef *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              *)&pSVar3->select_list,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_30);
  if (local_30._M_head_impl != (TableRef *)0x0) {
    (*(local_30._M_head_impl)->_vptr_TableRef[1])();
  }
  local_30._M_head_impl = (TableRef *)0x0;
  if (local_28 != (TableRef *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  (**(code **)(*in_RSI + 0x38))(&local_30);
  pSVar3 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_20);
  _Var2._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (TableRef *)0x0;
  _Var1._M_head_impl =
       (pSVar3->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar3->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    if (local_30._M_head_impl != (TableRef *)0x0) {
      (*(local_30._M_head_impl)->_vptr_TableRef[1])();
    }
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> ValueRelation::GetQueryNode() {
	auto result = make_uniq<SelectNode>();
	result->select_list.push_back(make_uniq<StarExpression>());
	result->from_table = GetTableRef();
	return std::move(result);
}